

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

void __thiscall
ArgWrapper<wchar_t>::
ArgWrapper<wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*>
          (ArgWrapper<wchar_t> *this,wchar_t *in_args,wchar_t *in_args_1,wchar_t *in_args_2,
          wchar_t *in_args_3,wchar_t *in_args_4,wchar_t *in_args_5,wchar_t *in_args_6)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l;
  allocator_type local_130;
  allocator<wchar_t> local_12f;
  allocator<wchar_t> local_12e;
  allocator<wchar_t> local_12d;
  allocator<wchar_t> local_12c;
  allocator<wchar_t> local_12b;
  allocator<wchar_t> local_12a;
  allocator<wchar_t> local_129;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_128;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_110;
  wstring local_f0 [32];
  wstring local_d0 [32];
  wstring local_b0 [32];
  wstring local_90 [32];
  wstring local_70 [32];
  wstring local_50 [16];
  long local_40 [2];
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_110,in_args,&local_129);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_f0,in_args_1,&local_12a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_d0,in_args_2,&local_12b);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_b0,in_args_3,&local_12c);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_90,in_args_4,&local_12d);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_70,in_args_5,&local_12e);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_50,in_args_6,&local_12f);
  __l._M_len = 7;
  __l._M_array = &local_110;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&local_128,__l,&local_130);
  ArgWrapper(this,&local_128);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_128);
  lVar1 = -0xe0;
  plVar2 = local_40;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

ArgWrapper(Args... in_args)
		: ArgWrapper{ std::vector<std::basic_string<CharT>>{ in_args... } } {
		// Empty ctor body
	}